

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void peach::exception::
     throwFromTokenIterator<peach::exception::UndefinedTokenError,unsigned_long,unsigned_long>
               (iterator *it)

{
  Token *pTVar1;
  UndefinedTokenError *this;
  
  this = (UndefinedTokenError *)__cxa_allocate_exception(0x38);
  pTVar1 = (it->_M_current->_M_t).
           super___uniq_ptr_impl<peach::token::Token,_std::default_delete<peach::token::Token>_>.
           _M_t.
           super__Tuple_impl<0UL,_peach::token::Token_*,_std::default_delete<peach::token::Token>_>.
           super__Head_base<0UL,_peach::token::Token_*,_false>._M_head_impl;
  UndefinedTokenError::UndefinedTokenError(this,pTVar1->line_,(long)(int)pTVar1->linePosition_);
  __cxa_throw(this,&UndefinedTokenError::typeinfo,PeachException::~PeachException);
}

Assistant:

inline void throwFromTokenIterator(const std::vector<token::TokenPtr>::iterator &it)
{
    throw ExceptionT((*it)->getLine(),
                     (*it)->getLinePosition());
}